

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

sqlite3_str * sqlite3_str_new(sqlite3 *db)

{
  sqlite3_str *psVar1;
  u32 uVar2;
  
  psVar1 = (sqlite3_str *)sqlite3_malloc64(0x20);
  if (psVar1 == (sqlite3_str *)0x0) {
    psVar1 = &sqlite3OomStr;
  }
  else {
    if (db == (sqlite3 *)0x0) {
      uVar2 = 1000000000;
    }
    else {
      uVar2 = db->aLimit[0];
    }
    psVar1->db = (sqlite3 *)0x0;
    psVar1->zText = (char *)0x0;
    psVar1->nAlloc = 0;
    psVar1->mxAlloc = uVar2;
    psVar1->nChar = 0;
    psVar1->accError = '\0';
    psVar1->printfFlags = '\0';
  }
  return psVar1;
}

Assistant:

SQLITE_API sqlite3_str *sqlite3_str_new(sqlite3 *db){
  sqlite3_str *p = sqlite3_malloc64(sizeof(*p));
  if( p ){
    sqlite3StrAccumInit(p, 0, 0, 0,
            db ? db->aLimit[SQLITE_LIMIT_LENGTH] : SQLITE_MAX_LENGTH);
  }else{
    p = &sqlite3OomStr;
  }
  return p;
}